

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.h
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::LoadableGetVariables
          (ChNodeFEAxyzDD *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvars)

{
  int iVar1;
  undefined4 extraout_var;
  ChVariables *local_20;
  
  iVar1 = (*(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
            [8])();
  local_20 = (ChVariables *)CONCAT44(extraout_var,iVar1);
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_20);
  local_20 = *(ChVariables **)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xe8;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_20);
  local_20 = *(ChVariables **)&(this->super_ChNodeFEAxyzD).field_0x138;
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_20);
  return;
}

Assistant:

virtual void LoadableGetVariables(std::vector<ChVariables*>& mvars) override {
        mvars.push_back(&Variables());
        mvars.push_back(&Variables_D());
        mvars.push_back(&Variables_DD());
    }